

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O1

CESkyCoord * __thiscall
CESkyCoord::ConvertToICRS
          (CESkyCoord *__return_storage_ptr__,CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CESkyCoord(__return_storage_ptr__);
  switch(this->coord_type_) {
  case CIRS:
    CIRS2ICRS(this,__return_storage_ptr__,date);
    break;
  case ICRS:
    SetCoordinates(__return_storage_ptr__,this);
    break;
  case GALACTIC:
    Galactic2ICRS(this,__return_storage_ptr__);
    break;
  case OBSERVED:
    Observed2ICRS(this,__return_storage_ptr__,date,observer);
    break;
  case ECLIPTIC:
    Ecliptic2ICRS(this,__return_storage_ptr__,date);
  }
  return __return_storage_ptr__;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToICRS(const CEDate&     date,
                                     const CEObserver& observer)
{
    // Create return coordinate
    CESkyCoord icrs;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> ICRS
        CIRS2ICRS(*this, &icrs, date);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> ICRS
        icrs.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> ICRS
        Galactic2ICRS(*this, &icrs);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> ICRS
        Observed2ICRS(*this, &icrs, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> ICRS
        Ecliptic2ICRS(*this, &icrs, date);
    }
    
    return icrs;
}